

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast-lstm.cc
# Opt level: O2

Expression __thiscall
dynet::FastLSTMBuilder::add_input_impl(FastLSTMBuilder *this,int prev,Expression *x)

{
  undefined8 *puVar1;
  bool bVar2;
  pointer pvVar3;
  long lVar4;
  pointer pEVar5;
  pointer pvVar6;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *pvVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Expression EVar11;
  Expression i_crt;
  Expression in;
  Expression i_wt;
  Expression i_it;
  Expression ph_t;
  Expression i_h_tm1;
  Expression i_ft;
  Expression i_ot;
  Expression local_188;
  ComputationGraph *local_178;
  pointer puStack_170;
  Expression local_168;
  Expression local_158;
  Expression local_148;
  Expression local_138;
  Expression local_128;
  pointer local_118;
  pointer pCStack_110;
  pointer local_108;
  pointer local_100;
  Expression local_f8;
  undefined1 local_e8 [16];
  pointer local_d8;
  pointer puStack_d0;
  ComputationGraph *local_c8;
  pointer puStack_c0;
  ExecutionEngine *local_b8;
  undefined8 uStack_b0;
  pointer local_a8;
  pointer pCStack_a0;
  Expression local_98;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *local_80;
  long local_78;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_70;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *local_68;
  FastLSTMBuilder *local_60;
  ulong local_58;
  Expression local_50;
  initializer_list<dynet::Expression> local_40;
  
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e8,
             (ulong)this->layers,(allocator_type *)&local_178);
  local_68 = &this->h;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_68,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e8);
  std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
            ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e8);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e8,
             (ulong)this->layers,(allocator_type *)&local_178);
  local_70 = &this->c;
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)local_70,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e8);
  std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
            ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)local_e8);
  local_100 = (this->h).
              super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_108 = (this->c).
              super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_178 = x->pg;
  puStack_170 = *(pointer *)&x->i;
  local_80 = &this->c0;
  lVar9 = 0;
  local_78 = (ulong)(uint)prev * 0x18;
  lVar8 = 0;
  local_58 = 0;
  local_60 = this;
  do {
    if (local_60->layers <= local_58) {
      return local_100[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1];
    }
    pvVar3 = (local_60->param_vars).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118 = (pointer)0x0;
    pCStack_110 = (pointer)0x0;
    local_98.pg = (ComputationGraph *)0x0;
    local_98.i = 0;
    local_98.graph_id = 0;
    bVar2 = local_60->has_initial_state;
    bVar10 = prev < 0;
    if (bVar10) {
      if ((bVar2 & 1U) != 0) {
        puVar1 = (undefined8 *)
                 ((long)&((local_60->h0).
                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                          _M_impl.super__Vector_impl_data._M_start)->pg + lVar8);
        local_118 = (pointer)*puVar1;
        pCStack_110 = (pointer)puVar1[1];
        pvVar7 = local_80;
        goto LAB_003df0fb;
      }
    }
    else {
      puVar1 = (undefined8 *)
               (*(long *)((long)&(((local_68->
                                   super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                 )._M_impl + local_78) + lVar8);
      local_118 = (pointer)*puVar1;
      pCStack_110 = (pointer)puVar1[1];
      pvVar7 = (vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               ((long)&(((local_70->
                         super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                       _M_impl + local_78);
LAB_003df0fb:
      puVar1 = (undefined8 *)
               ((long)&((pvVar7->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data._M_start)->pg + lVar8);
      local_98.pg = (ComputationGraph *)*puVar1;
      local_98._8_8_ = puVar1[1];
    }
    local_128 = (Expression)ZEXT816(0);
    if (bVar10 && (bVar2 & 1U) == 0) {
      local_e8 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar3->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar9) + 0x30);
      puVar1 = *(undefined8 **)
                ((long)&(pvVar3->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data + lVar9);
      local_d8 = (pointer)*puVar1;
      puStack_d0 = (pointer)puVar1[1];
      local_c8 = local_178;
      puStack_c0 = puStack_170;
      local_158.i = 3;
      local_158.graph_id = 0;
      local_158.pg = (ComputationGraph *)local_e8;
      local_128 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&local_158);
    }
    else {
      local_e8 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar3->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar9) + 0x30);
      puVar1 = *(undefined8 **)
                ((long)&(pvVar3->
                        super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                        _M_impl.super__Vector_impl_data + lVar9);
      local_d8 = (pointer)*puVar1;
      puStack_d0 = (pointer)puVar1[1];
      local_c8 = local_178;
      puStack_c0 = puStack_170;
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_b8 = *(ExecutionEngine **)(lVar4 + 0x10);
      uStack_b0 = *(undefined8 *)(lVar4 + 0x18);
      local_a8 = local_118;
      pCStack_a0 = pCStack_110;
      local_f8.i = 5;
      local_f8.graph_id = 0;
      local_f8.pg = (ComputationGraph *)local_e8;
      local_158 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&local_f8);
      local_148 = cmult((Expression *)
                        (*(long *)((long)&(pvVar3->
                                          super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                          )._M_impl.super__Vector_impl_data + lVar9) + 0x20),
                        &local_98);
      local_128 = operator+(&local_158,&local_148);
    }
    local_158 = logistic(&local_128);
    local_f8 = operator-(1.0,&local_158);
    local_148 = (Expression)ZEXT816(0);
    if (bVar10 && (bVar2 & 1U) == 0) {
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_e8._0_8_ = *(undefined8 *)(lVar4 + 0xa0);
      local_e8._8_8_ = *(undefined8 *)(lVar4 + 0xa8);
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_d8 = *(pointer *)(lVar4 + 0x80);
      puStack_d0 = *(pointer *)(lVar4 + 0x88);
      local_168.i = 3;
      local_168.graph_id = 0;
    }
    else {
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_e8._0_8_ = *(undefined8 *)(lVar4 + 0xa0);
      local_e8._8_8_ = *(undefined8 *)(lVar4 + 0xa8);
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_d8 = *(pointer *)(lVar4 + 0x80);
      puStack_d0 = *(pointer *)(lVar4 + 0x88);
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_b8 = *(ExecutionEngine **)(lVar4 + 0x90);
      uStack_b0 = *(undefined8 *)(lVar4 + 0x98);
      local_a8 = local_118;
      pCStack_a0 = pCStack_110;
      local_168.i = 5;
      local_168.graph_id = 0;
    }
    puStack_c0 = puStack_170;
    local_c8 = local_178;
    local_168.pg = (ComputationGraph *)local_e8;
    local_148 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                          ((initializer_list<dynet::Expression> *)&local_168);
    tanh((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (bVar10 && (bVar2 & 1U) == 0) {
      EVar11 = cmult(&local_158,&local_168);
      pEVar5 = local_108[-1].
               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(ComputationGraph **)((long)&pEVar5->pg + lVar8) = EVar11.pg;
      *(long *)((long)&pEVar5->i + lVar8) = EVar11._8_8_;
      local_188 = (Expression)ZEXT816(0);
      local_e8 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar3->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar9) + 0x70);
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_d8 = *(pointer *)(lVar4 + 0x40);
      puStack_d0 = *(pointer *)(lVar4 + 0x48);
      local_c8 = local_178;
      puStack_c0 = puStack_170;
      local_138.i = 3;
      local_138.graph_id = 0;
      local_138.pg = (ComputationGraph *)local_e8;
      local_188 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&local_138);
    }
    else {
      local_e8 = (undefined1  [16])cmult(&local_158,&local_168);
      local_188 = cmult(&local_f8,&local_98);
      EVar11 = operator+(&local_188,(Expression *)local_e8);
      pvVar6 = local_108;
      pEVar5 = local_108[-1].
               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(ComputationGraph **)((long)&pEVar5->pg + lVar8) = EVar11.pg;
      *(long *)((long)&pEVar5->i + lVar8) = EVar11._8_8_;
      local_188 = (Expression)ZEXT816(0);
      local_e8 = *(undefined1 (*) [16])
                  (*(long *)((long)&(pvVar3->
                                    super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                    )._M_impl.super__Vector_impl_data + lVar9) + 0x70);
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_d8 = *(pointer *)(lVar4 + 0x40);
      puStack_d0 = *(pointer *)(lVar4 + 0x48);
      local_c8 = local_178;
      puStack_c0 = puStack_170;
      lVar4 = *(long *)((long)&(pvVar3->
                               super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                               )._M_impl.super__Vector_impl_data + lVar9);
      local_b8 = *(ExecutionEngine **)(lVar4 + 0x50);
      uStack_b0 = *(undefined8 *)(lVar4 + 0x58);
      local_a8 = local_118;
      pCStack_a0 = pCStack_110;
      local_40._M_len = 5;
      local_40._M_array = (iterator)local_e8;
      local_138 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            (&local_40);
      local_50 = cmult((Expression *)
                       (*(long *)((long)&(pvVar3->
                                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                         )._M_impl.super__Vector_impl_data + lVar9) + 0x60),
                       (Expression *)
                       ((long)&(pvVar6[-1].
                                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                ._M_impl.super__Vector_impl_data._M_start)->pg + lVar8));
      local_188 = operator+(&local_138,&local_50);
    }
    local_e8 = (undefined1  [16])logistic(&local_188);
    tanh((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    EVar11 = cmult((Expression *)local_e8,&local_138);
    pEVar5 = local_100[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ComputationGraph **)((long)&pEVar5->pg + lVar8) = EVar11.pg;
    *(long *)((long)&pEVar5->i + lVar8) = EVar11._8_8_;
    puVar1 = (undefined8 *)((long)&pEVar5->pg + lVar8);
    local_178 = (ComputationGraph *)*puVar1;
    puStack_170 = (pointer)puVar1[1];
    local_58 = local_58 + 1;
    lVar8 = lVar8 + 0x10;
    lVar9 = lVar9 + 0x18;
  } while( true );
}

Assistant:

Expression FastLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state) {
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + cmult(vars[C2I], i_c_tm1);
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1}) +
              cmult(vars[C2I], i_c_tm1);
    } else {
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    }
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it,i_wt);
      Expression i_crt = cmult(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cmult(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state) {
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + cmult(vars[C2O], ct[i]);
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1}) +
              cmult(vars[C2O], ct[i]);
    }
    else {
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    }
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot,ph_t);
  }
  return ht.back();
}